

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seq.c
# Opt level: O2

void coll_seq_reverse(coll_seq_t *seq)

{
  coll_seq_node_t *pcVar1;
  coll_seq_node_t *pcVar2;
  coll_seq_node_t *pcVar3;
  
  pcVar2 = (coll_seq_node_t *)0x0;
  pcVar3 = seq->head;
  while (pcVar3 != (coll_seq_node_t *)0x0) {
    pcVar1 = pcVar3->next;
    pcVar3->next = pcVar2;
    pcVar2 = pcVar3;
    pcVar3 = pcVar1;
  }
  seq->head = pcVar2;
  return;
}

Assistant:

void coll_seq_reverse(coll_seq_t *seq) {
    node_t *prev = NULL, *cur = seq->head, *next;
    while (cur) {
        next = cur->next;
        cur->next = prev;
        prev = cur;
        cur = next;
    }
    seq->head = prev;
}